

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O0

void test_read_format_rar_unicode_CP932(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  archive_conflict *a_00;
  time_t tVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  archive *a;
  archive_entry *ae;
  char local_58 [2];
  char test_txt [6];
  char reffile [33];
  undefined1 local_28 [8];
  char buff [30];
  
  memcpy(local_58,"test_read_format_rar_unicode.rar",0x21);
  ae._2_4_ = 0x6a6e616b;
  ae._6_2_ = 0x69;
  pcVar4 = setlocale(6,"Japanese_Japan");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ja_JP.SJIS"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ŝ');
    test_skipping("CP932 locale not available on this system.");
    return;
  }
  extract_reference_file(local_58);
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ţ',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL"
                   ,(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ţ',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ť',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a_00);
  iVar1 = archive_read_set_options((archive *)a_00,"rar:hdrcharset=UTF-8");
  if (iVar1 == 0) {
    wVar2 = archive_read_open_filename(a_00,local_58,0x2800);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ŭ',(uint)(wVar2 == L'\0'),
                     "0 == archive_read_open_filename(a, reffile, 10240)",a_00);
    iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ů',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'ų',anon_var_dwarf_29a14,
               "\"\\x95\\x5c\\x82\\xbe\\x82\\xe6/\\x90\\x56\\x82\\xb5\\x82\\xa2\" \"\\x83\\x74\\x83\\x48\\x83\\x8b\\x83\\x5f/\\x90\\x56\\x8b\\x4b\\x83\\x65\\x83\\x4c\" \"\\x83\\x58\\x83\\x67 \\x83\\x68\\x83\\x4c\\x83\\x85\\x83\\x81\\x83\\x93\\x83\\x67.txt\""
               ,pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar5 = archive_entry_mtime((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ŵ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ŵ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ŷ',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ŷ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ÿ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
    iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ż',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'ſ',anon_var_dwarf_29a36,
               "\"\\x95\\x5c\\x82\\xbe\\x82\\xe6/\\x8a\\xbf\\x8e\\x9a\" \"\\x92\\xb7\\x82\\xa2\\x83\\x74\\x83\\x40\\x83\\x43\\x83\\x8b\\x96\\xbc\\x6c\" \"\\x6f\\x6e\\x67\\x2d\\x66\\x69\\x6c\\x65\\x6e\\x61\\x6d\\x65\\x2d\\x69\\x6e\" \"\\x2d\\x8a\\xbf\\x8e\\x9a.txt\""
               ,pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar5 = archive_entry_mtime((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ƀ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ɓ',5,"5",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ƃ',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ƃ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ƅ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
    lVar7 = archive_read_data((archive *)a_00,local_28,5);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ƅ',(uint)(lVar7 == 5),"5 == archive_read_data(a, buff, 5)",a_00);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ɔ',local_28,"buff",(void *)((long)&ae + 2),"test_txt",5,"5",(void *)0x0)
    ;
    iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ɖ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'ƌ',anon_var_dwarf_29a6f,
               "\"\\x95\\x5c\\x82\\xbe\\x82\\xe6/\" \"\\x90\\x56\\x82\\xb5\\x82\\xa2\\x83\\x74\\x83\\x48\\x83\\x8b\\x83\\x5f\""
               ,pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar5 = archive_entry_mtime((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ƍ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ǝ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ə',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ɛ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ƒ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
    iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ɣ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'ƕ',anon_var_dwarf_29a91,"\"\\x95\\x5c\\x82\\xbe\\x82\\xe6\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar5 = archive_entry_mtime((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ɩ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ɨ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ƙ',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ƙ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ƚ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
    iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ɲ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'Ɵ',anon_var_dwarf_29aa7,
               "\"\\x95\\x5c\\x82\\xbe\\x82\\xe6/\" \"\\x83\\x74\\x83\\x40\\x83\\x43\\x83\\x8B\"",
               pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    pcVar4 = archive_entry_symlink((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'ƣ',anon_var_dwarf_29a36 + 7,
               "\"\\x8a\\xbf\\x8e\\x9a\" \"\\x92\\xb7\\x82\\xa2\\x83\\x74\\x83\\x40\\x83\\x43\\x83\\x8b\\x96\\xbc\\x6c\" \"\\x6f\\x6e\\x67\\x2d\\x66\\x69\\x6c\\x65\\x6e\\x61\\x6d\\x65\\x2d\\x69\\x6e\" \"\\x2d\\x8a\\xbf\\x8e\\x9a.txt\""
               ,pcVar4,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
    tVar5 = archive_entry_mtime((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ƥ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ƥ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ʀ',0xa1ed,"41453",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ƨ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ƨ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
    lVar7 = archive_read_data((archive *)a_00,local_28,0x1e);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ʃ',0,"0",lVar7,"archive_read_data(a, buff, sizeof(buff))",a_00);
    iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ƭ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'Ư',anon_var_dwarf_29b03,
               "\"abcdefghijklmnopqrs\\x83\\x65\\x83\\x58\\x83\\x67.txt\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\x01');
    tVar5 = archive_entry_mtime((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ư',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ʊ',0x10,"16",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ʋ',0x81b4,"33204",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ƴ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ƴ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
    lVar7 = archive_read_data((archive *)a_00,local_28,0x1e);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ƶ',0x10,"16",lVar7,"archive_read_data(a, buff, sizeof(buff))",a_00);
    iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ƹ',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a_00);
    iVar1 = archive_file_count((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ƹ',6,"6",(long)iVar1,"archive_file_count(a)",(void *)0x0);
    iVar1 = archive_read_close((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ƺ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a_00);
    iVar1 = archive_read_free((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ƻ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ŧ');
    test_skipping("This system cannot convert character-set from UTF-8 to CP932.");
    iVar1 = archive_read_free((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ũ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar_unicode_CP932)
{
  char buff[30];
  const char reffile[] = "test_read_format_rar_unicode.rar";
  const char test_txt[] = "kanji";
  struct archive_entry *ae;
  struct archive *a;

  if (NULL == setlocale(LC_ALL, "Japanese_Japan") &&
    NULL == setlocale(LC_ALL, "ja_JP.SJIS")) {
	skipping("CP932 locale not available on this system.");
	return;
  }

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_support_filter_all(a));
  assertA(0 == archive_read_support_format_all(a));
  /* Specify the charset of symbolic-link file name. */
  if (ARCHIVE_OK != archive_read_set_options(a, "rar:hdrcharset=UTF-8")) {
	skipping("This system cannot convert character-set"
	    " from UTF-8 to CP932.");
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	return;
  }
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("\x95\x5c\x82\xbe\x82\xe6/\x90\x56\x82\xb5\x82\xa2"
      "\x83\x74\x83\x48\x83\x8b\x83\x5f/\x90\x56\x8b\x4b\x83\x65\x83\x4c"
      "\x83\x58\x83\x67 \x83\x68\x83\x4c\x83\x85\x83\x81\x83\x93\x83\x67.txt",
      archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("\x95\x5c\x82\xbe\x82\xe6/\x8a\xbf\x8e\x9a"
      "\x92\xb7\x82\xa2\x83\x74\x83\x40\x83\x43\x83\x8b\x96\xbc\x6c"
      "\x6f\x6e\x67\x2d\x66\x69\x6c\x65\x6e\x61\x6d\x65\x2d\x69\x6e"
      "\x2d\x8a\xbf\x8e\x9a.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(5, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(5 == archive_read_data(a, buff, 5));
  assertEqualMem(buff, test_txt, 5);

  /* Third header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("\x95\x5c\x82\xbe\x82\xe6/"
      "\x90\x56\x82\xb5\x82\xa2\x83\x74\x83\x48\x83\x8b\x83\x5f",
      archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Fourth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("\x95\x5c\x82\xbe\x82\xe6", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Fifth header, which has a symbolic-link name in multi-byte characters. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("\x95\x5c\x82\xbe\x82\xe6/"
      "\x83\x74\x83\x40\x83\x43\x83\x8B", archive_entry_pathname(ae));
  assertEqualString("\x8a\xbf\x8e\x9a"
      "\x92\xb7\x82\xa2\x83\x74\x83\x40\x83\x43\x83\x8b\x96\xbc\x6c"
      "\x6f\x6e\x67\x2d\x66\x69\x6c\x65\x6e\x61\x6d\x65\x2d\x69\x6e"
      "\x2d\x8a\xbf\x8e\x9a.txt", archive_entry_symlink(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(41453, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertEqualIntA(a, 0, archive_read_data(a, buff, sizeof(buff)));

  /* Sixth header */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualUTF8String(
    "abcdefghijklmnopqrs\x83\x65\x83\x58\x83\x67.txt",
    archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(16, archive_entry_size(ae));
  assertEqualInt(33204, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertEqualIntA(a, 16, archive_read_data(a, buff, sizeof(buff)));

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(6, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}